

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O2

void __thiscall
slang::ast::StructurePattern::serializeTo(StructurePattern *this,ASTSerializer *serializer)

{
  FieldPattern *fp;
  pointer pFVar1;
  long lVar2;
  string_view name;
  string_view name_00;
  
  name._M_str = "patterns";
  name._M_len = 8;
  ASTSerializer::startArray(serializer,name);
  pFVar1 = (this->patterns)._M_ptr;
  for (lVar2 = (this->patterns)._M_extent._M_extent_value << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    ASTSerializer::startObject(serializer);
    name_00._M_str = "field";
    name_00._M_len = 5;
    ASTSerializer::writeLink(serializer,name_00,(Symbol *)(pFVar1->field).ptr);
    ASTSerializer::write(serializer,7,"pattern",(size_t)(pFVar1->pattern).ptr);
    ASTSerializer::endObject(serializer);
    pFVar1 = pFVar1 + 1;
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void StructurePattern::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("patterns");
    for (auto& fp : patterns) {
        serializer.startObject();
        serializer.writeLink("field", *fp.field);
        serializer.write("pattern", *fp.pattern);
        serializer.endObject();
    }
    serializer.endArray();
}